

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void highbd_inter_predictor
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,SubpelParams *subpel_params,
               int w,int h,ConvolveParams *conv_params,InterpFilterParams **interp_filters,int bd)

{
  int w_00;
  int in_ECX;
  uint8_t *in_RDX;
  int *in_R8;
  int in_R9D;
  InterpFilterParams **unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  ConvolveParams *in_stack_00000030;
  int in_stack_00000038;
  SubpelParams sp;
  int is_scaled;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 in_stack_ffffffffffffffa0;
  int iVar1;
  
  iVar1 = SUB84(in_stack_ffffffffffffffa0,4);
  w_00 = has_scale(*in_R8,in_R8[1]);
  if (w_00 == 0) {
    local_70._0_4_ = in_R8[0];
    local_70._4_4_ = in_R8[1];
    local_68._0_4_ = in_R8[2];
    local_68._4_4_ = in_R8[3];
    iVar1 = (int)((ulong)*(undefined8 *)(in_R8 + 4) >> 0x20);
    revert_scale_extra_bits((SubpelParams *)&local_70);
    av1_highbd_convolve_2d_facade
              (in_RDX,in_ECX,(uint8_t *)in_R8,in_R9D,w_00,iVar1,unaff_retaddr,in_stack_00000008,
               in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
               in_stack_00000030,in_stack_00000038);
  }
  else {
    av1_highbd_convolve_2d_facade
              (in_RDX,in_ECX,(uint8_t *)in_R8,in_R9D,w_00,iVar1,unaff_retaddr,in_stack_00000008,
               in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
               in_stack_00000030,in_stack_00000038);
  }
  return;
}

Assistant:

static inline void highbd_inter_predictor(
    const uint8_t *src, int src_stride, uint8_t *dst, int dst_stride,
    const SubpelParams *subpel_params, int w, int h,
    ConvolveParams *conv_params, const InterpFilterParams *interp_filters[2],
    int bd) {
  assert(conv_params->do_average == 0 || conv_params->do_average == 1);
  const int is_scaled = has_scale(subpel_params->xs, subpel_params->ys);
  if (is_scaled) {
    av1_highbd_convolve_2d_facade(src, src_stride, dst, dst_stride, w, h,
                                  interp_filters, subpel_params->subpel_x,
                                  subpel_params->xs, subpel_params->subpel_y,
                                  subpel_params->ys, 1, conv_params, bd);
  } else {
    SubpelParams sp = *subpel_params;
    revert_scale_extra_bits(&sp);
    av1_highbd_convolve_2d_facade(src, src_stride, dst, dst_stride, w, h,
                                  interp_filters, sp.subpel_x, sp.xs,
                                  sp.subpel_y, sp.ys, 0, conv_params, bd);
  }
}